

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<long_long,_unsigned_char,_12>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (longlong *lhs,uchar *rhs,longlong *result)

{
  long *in_RDX;
  byte *in_RSI;
  long *in_RDI;
  uint64_t tmp;
  
  if (*in_RDI <= (long)(*in_RDI + (ulong)*in_RSI)) {
    *in_RDX = *in_RDI + (ulong)*in_RSI;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is std::int64_t, rhs unsigned < 64-bit
        // Some compilers get optimization-happy, let's thwart them

        std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

        if( (std::int64_t)tmp >= lhs )
        {
            result = (T)(std::int64_t)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }